

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

int io::posix::detail::open_mode_to_posix_mode(open_mode m)

{
  uint uVar1;
  
  uVar1 = 0xc0;
  if ((m & always_create) == 0) {
    uVar1 = m * 2 & 0x40;
  }
  return uVar1 | (m & (append|truncate)) << 6 | m >> 1 & 3;
}

Assistant:

constexpr int open_mode_to_posix_mode(open_mode m)
{
    int p = 0;
    if ((m & open_mode::read_only) != static_cast<open_mode>(0)) {
        p |= O_RDONLY;
    }
    if ((m & open_mode::write_only) != static_cast<open_mode>(0)) {
        p |= O_WRONLY;
    }
    if ((m & open_mode::read_write) != static_cast<open_mode>(0)) {
        p |= O_RDWR;
    }
    if ((m & open_mode::truncate) != static_cast<open_mode>(0)) {
        p |= O_TRUNC;
    }
    if ((m & open_mode::append) != static_cast<open_mode>(0)) {
        p |= O_APPEND;
    }
    if ((m & open_mode::create) != static_cast<open_mode>(0)) {
        p |= O_CREAT;
    }
    if ((m & open_mode::always_create) != static_cast<open_mode>(0)) {
        p |= (O_CREAT | O_EXCL);
    }

    return p;
}